

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O0

void __thiscall
Ratio::addAllFEdges(Ratio *this,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges)

{
  bool bVar1;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  *__lhs;
  iterator edges_00;
  reference this_00;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_RSI;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_RDI;
  pointer pPVar2;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *unaff_retaddr;
  PhyloTreeEdge *f;
  iterator __end1;
  iterator __begin1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1;
  value_type *__x;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__n;
  
  __x = (value_type *)
        &in_RDI[1].super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  __n = in_RDI;
  __lhs = (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
           *)std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        &in_RDI[1].super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size(in_RSI);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve(unaff_retaddr,(size_type)__n);
  edges_00 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin(in_RDI);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                              *)in_RDI);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
              ::operator*((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                           *)&stack0xffffffffffffffe0);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)this_00,__x);
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator++((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  pPVar2 = (pointer)geoAvg((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                           edges_00._M_current);
  (in_RDI->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
  super__Vector_impl_data._M_finish = pPVar2;
  return;
}

Assistant:

void Ratio::addAllFEdges(vector<PhyloTreeEdge>& edges) {
    fEdges.reserve(fEdges.size() + edges.size());
    for (auto &f : edges) {
        fEdges.push_back(f);
    }
    fLength = geoAvg(fEdges);
}